

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::OnTryTableCatch(SharedValidator *this,Location *loc,TableCatch *catch_)

{
  size_t sVar1;
  char *pcVar2;
  undefined8 uVar3;
  CatchKind CVar4;
  Result RVar5;
  Result RVar6;
  bool bVar7;
  TagType tag_type;
  TagType local_88;
  Type local_70;
  Var local_68;
  
  local_88.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar1 = (loc->filename)._M_len;
  pcVar2 = (loc->filename)._M_str;
  uVar3 = *(undefined8 *)((long)&loc->field_1 + 8);
  (this->expr_loc_).field_1.field_1.offset = (loc->field_1).field_1.offset;
  *(undefined8 *)((long)&(this->expr_loc_).field_1 + 8) = uVar3;
  (this->expr_loc_).filename._M_len = sVar1;
  (this->expr_loc_).filename._M_str = pcVar2;
  CVar4 = catch_->kind;
  if ((CVar4 & ~CatchRef) == CatchAll) {
    bVar7 = false;
  }
  else {
    Var::Var(&local_68,&catch_->tag);
    RVar5 = CheckTagIndex(this,&local_68,&local_88);
    bVar7 = RVar5.enum_ == Error;
    Var::~Var(&local_68);
    CVar4 = catch_->kind;
  }
  if ((CVar4 & ~CatchAll) == CatchRef) {
    local_70.enum_ = ExnRef;
    local_70.type_index_ = 0;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::emplace_back<wabt::Type>
              (&local_88.params,&local_70);
  }
  if ((catch_->target).type_ == Index) {
    RVar5 = TypeChecker::OnTryTableCatch
                      (&this->typechecker_,&local_88.params,(catch_->target).field_2.index_);
    if (local_88.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.params.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.params.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    RVar6.enum_._1_3_ = 0;
    RVar6.enum_._0_1_ = bVar7 | RVar5.enum_ == Error;
    return (Result)RVar6.enum_;
  }
  __assert_fail("is_index()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/ir.h"
                ,0x3b,"Index wabt::Var::index() const");
}

Assistant:

Result SharedValidator::OnTryTableCatch(const Location& loc,
                                        const TableCatch& catch_) {
  Result result = Result::Ok;
  TagType tag_type;
  expr_loc_ = loc;
  if (!catch_.IsCatchAll()) {
    result |= CheckTagIndex(catch_.tag, &tag_type);
  }
  if (catch_.IsRef()) {
    tag_type.params.push_back(Type::ExnRef);
  }
  result |=
      typechecker_.OnTryTableCatch(tag_type.params, catch_.target.index());
  return result;
}